

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O0

void __thiscall QFbCursor::pointerEvent(QFbCursor *this,QMouseEvent *e)

{
  Type TVar1;
  QPoint this_00;
  QPoint *extraout_RDX;
  QEvent *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QRect *in_stack_ffffffffffffff68;
  byte local_81;
  QFbCursor *in_stack_ffffffffffffff98;
  QPoint *p;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = QEvent::type(in_RSI);
  if (TVar1 == MouseMove) {
    local_20 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x1202de);
    local_10 = QPointF::toPoint(in_RDI);
    in_RDI[5].yp = (qreal)local_10;
    if (((ulong)in_RDI[1].xp & 1) != 0) {
      local_30 = (undefined1  [16])getCurrentRect(in_stack_ffffffffffffff98);
      in_RDI[2].xp = (qreal)local_30._0_8_;
      in_RDI[2].yp = (qreal)local_30._8_8_;
      local_81 = 1;
      if (((ulong)in_RDI[4].xp & 0x100) == 0) {
        local_40 = (**(code **)(*(long *)in_RDI[1].yp + 0x68))();
        (**(code **)(*(long *)in_RDI[1].yp + 0x68))();
        p = extraout_RDX;
        this_00 = QRect::topLeft(in_stack_ffffffffffffff68);
        QRect::translated((QRect *)this_00,p);
        local_81 = QRect::intersects((QRect *)local_40);
      }
      if ((local_81 & 1) != 0) {
        (**(code **)((long)in_RDI->xp + 0xa0))();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbCursor::pointerEvent(const QMouseEvent &e)
{
    if (e.type() != QEvent::MouseMove)
        return;
    m_pos = e.globalPosition().toPoint();
    if (!mVisible)
        return;
    mCurrentRect = getCurrentRect();
    if (mOnScreen || mScreen->geometry().intersects(mCurrentRect.translated(mScreen->geometry().topLeft())))
        setDirty();
}